

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O3

void __thiscall
protozero::basic_pbf_writer<std::__cxx11::string>::
add_packed_varint<std::istream_iterator<int,char,std::char_traits<char>,long>>
          (basic_pbf_writer<std::__cxx11::string> *this,pbf_tag_type tag,
          istream_iterator<int,_char,_std::char_traits<char>,_long> *first,
          istream_iterator<int,_char,_std::char_traits<char>,_long> *last)

{
  int iVar1;
  basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sw;
  basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  if ((first->_M_ok != last->_M_ok) ||
     ((first->_M_ok != false && (first->_M_stream != last->_M_stream)))) {
    local_40.m_data = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
    local_40.m_rollback_pos = 0;
    local_40.m_pos = 0;
    local_40.m_parent_writer =
         (basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)this;
    basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::open_submessage((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this,tag,0);
    while ((first->_M_ok != last->_M_ok ||
           ((first->_M_ok != false && (first->_M_stream != last->_M_stream))))) {
      iVar1 = first->_M_value;
      std::istream_iterator<int,_char,_std::char_traits<char>,_long>::_M_read(first);
      basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::add_varint(&local_40,(long)iVar1);
    }
    basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~basic_pbf_writer(&local_40);
  }
  return;
}

Assistant:

void add_packed_varint(pbf_tag_type tag, It first, It last) { // NOLINT(performance-unnecessary-value-param)
        if (first == last) {
            return;
        }

        basic_pbf_writer sw{*this, tag};

        while (first != last) {
            sw.add_varint(uint64_t(*first++));
        }
    }